

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_chunk(LexState *ls)

{
  int iVar1;
  bool bVar2;
  int local_14;
  int islast;
  LexState *ls_local;
  
  local_14 = 0;
  synlevel_begin(ls);
  while( true ) {
    bVar2 = false;
    if (local_14 == 0) {
      iVar1 = parse_isend(ls->tok);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    local_14 = parse_stmt(ls);
    lex_opt(ls,0x3b);
    ls->fs->freereg = ls->fs->nactvar;
  }
  ls->level = ls->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}